

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O0

void __thiscall charls::jpeg_stream_reader::read_start_of_scan_segment(jpeg_stream_reader *this)

{
  int iVar1;
  byte bVar2;
  uint8_t uVar3;
  uint32_t maximum_sample_value;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  interleave_mode mode;
  uint8_t mapping_table_selector;
  size_t i;
  size_t component_count_in_scan;
  jpeg_stream_reader *this_local;
  
  check_minimal_segment_size(this,1);
  bVar2 = read_uint8(this);
  uVar5 = (ulong)bVar2;
  bVar6 = true;
  if ((uVar5 != 0) && (bVar6 = true, uVar5 < 5)) {
    bVar6 = (ulong)(long)(this->frame_info_).component_count < uVar5;
  }
  if (bVar6) {
    impl::throw_jpegls_error(invalid_parameter_component_count);
  }
  bVar6 = false;
  if (uVar5 != 1) {
    bVar6 = uVar5 != (long)(this->frame_info_).component_count;
  }
  if (bVar6) {
    impl::throw_jpegls_error(ParameterValueNotSupported);
  }
  check_segment_size(this,uVar5 * 2 + 4);
  for (_mode = 0; _mode != uVar5; _mode = _mode + 1) {
    skip_byte(this);
    uVar3 = read_uint8(this);
    if (uVar3 != '\0') {
      impl::throw_jpegls_error(ParameterValueNotSupported);
    }
  }
  bVar2 = read_uint8(this);
  (this->parameters_).near_lossless = (uint)bVar2;
  iVar1 = (this->parameters_).near_lossless;
  maximum_sample_value = jpeg_stream_reader::maximum_sample_value(this);
  iVar4 = compute_maximum_near_lossless(maximum_sample_value);
  if (iVar4 < iVar1) {
    impl::throw_jpegls_error(invalid_parameter_near_lossless);
  }
  bVar2 = read_byte(this);
  check_interleave_mode(this,(uint)bVar2);
  (this->parameters_).interleave_mode = (uint)bVar2;
  bVar2 = read_byte(this);
  if ((bVar2 & 0xf) == 0) {
    this->state_ = bit_stream_section;
    return;
  }
  impl::throw_jpegls_error(ParameterValueNotSupported);
}

Assistant:

void jpeg_stream_reader::read_start_of_scan_segment()
{
    check_minimal_segment_size(1);
    const size_t component_count_in_scan{read_uint8()};

    // ISO 10918-1, B2.3. defines the limits for the number of image components parameter in a SOS.
    if (UNLIKELY(component_count_in_scan < 1U || component_count_in_scan > 4U ||
                 component_count_in_scan > static_cast<size_t>(frame_info_.component_count)))
        throw_jpegls_error(jpegls_errc::invalid_parameter_component_count);

    if (UNLIKELY(component_count_in_scan != 1 &&
                 component_count_in_scan != static_cast<size_t>(frame_info_.component_count)))
        throw_jpegls_error(jpegls_errc::parameter_value_not_supported);

    check_segment_size((component_count_in_scan * 2) + 4);

    for (size_t i{}; i != component_count_in_scan; ++i)
    {
        skip_byte(); // Skip scan component selector
        const uint8_t mapping_table_selector{read_uint8()};
        if (UNLIKELY(mapping_table_selector != 0))
            throw_jpegls_error(jpegls_errc::parameter_value_not_supported);
    }

    parameters_.near_lossless = read_uint8(); // Read NEAR parameter
    if (UNLIKELY(parameters_.near_lossless > compute_maximum_near_lossless(static_cast<int>(maximum_sample_value()))))
        throw_jpegls_error(jpegls_errc::invalid_parameter_near_lossless);

    const auto mode{static_cast<interleave_mode>(read_byte())}; // Read ILV parameter
    check_interleave_mode(mode);
    parameters_.interleave_mode = mode;

    if (UNLIKELY((read_byte() & 0xFU) != 0)) // Read Ah (no meaning) and Al (point transform).
        throw_jpegls_error(jpegls_errc::parameter_value_not_supported);

    state_ = state::bit_stream_section;
}